

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
* active_var(map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             *__return_storage_ptr__,
            map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            *nodes)

{
  VarId *pVVar1;
  element_type *peVar2;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__v;
  __index_type _Var3;
  _Rb_tree_color _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  _Rb_tree_color _Var7;
  element_type *peVar8;
  element_type *peVar9;
  int *piVar10;
  BasicBlock *b;
  _Map_pointer ppiVar11;
  undefined1 auVar12 [8];
  bool bVar13;
  int iVar14;
  _Base_ptr p_Var15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar17;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar18;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar19;
  _func_int **pp_Var20;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar21;
  mapped_type *pmVar22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  ostream *poVar25;
  _Rb_tree_node_base *p_Var26;
  ulong uVar27;
  ulong uVar28;
  uint32_t *puVar29;
  _Base_ptr p_Var30;
  _Base_ptr p_Var31;
  uint32_t *puVar32;
  _Base_ptr p_Var33;
  _Self __tmp_1;
  key_type *__k;
  _Base_ptr p_Var34;
  _Base_ptr p_Var35;
  ulong uVar36;
  ulong uVar37;
  _Self __tmp_3;
  _Rb_tree_header *p_Var38;
  _Self __tmp;
  ulong uVar39;
  long lVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar41;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  global;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v;
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *blocks;
  vector<int,_std::allocator<int>_> visit;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  VarId s;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  in;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  def;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  out;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  use;
  undefined1 local_728 [8];
  VarId *pVStack_720;
  _Base_ptr local_718;
  _Rb_tree_node_base *local_710;
  _Rb_tree_node_base *local_708;
  size_t local_700;
  undefined1 local_6f8 [8];
  VarId *pVStack_6f0;
  VarId *local_6e8;
  _Base_ptr local_6e0;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
  *local_6b0;
  _Rb_tree_node_base *local_6a8;
  _Rb_tree_node_base *local_6a0;
  void *local_698;
  iterator iStack_690;
  int *local_688;
  undefined1 local_678 [16];
  pointer local_668;
  pointer pVStack_660;
  pointer local_658;
  _Map_pointer ppiStack_650;
  pointer local_648;
  _Elt_pointer piStack_640;
  _Elt_pointer local_638;
  _Map_pointer ppiStack_630;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_628;
  _Base_ptr local_620;
  undefined1 local_618 [8];
  VarId *pVStack_610;
  _Base_ptr local_608;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5e0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5c8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5b0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_598;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_580;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_568;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_550;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_538;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_520;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_508;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4f0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4d8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4c0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4a8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_490;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_478;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_460;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_448;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_430;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_418;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_400;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3e8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3d0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3b8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3a0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_388;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_370;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_358;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_328;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_310;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_2f8;
  VarId local_2c8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_2b8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_288;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_270;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_258;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_240;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_228;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_210;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_1f8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_1e0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_1c8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_1b0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_180;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_150;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_120;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_60;
  
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f8._M_impl.super__Rb_tree_header._M_header;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b0._M_impl.super__Rb_tree_header._M_header;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_358._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_358._M_impl.super__Rb_tree_header._M_header;
  local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6b0 = (_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
               *)__return_storage_ptr__;
  local_628 = nodes;
  local_358._M_impl.super__Rb_tree_header._M_header._M_right =
       local_358._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::_Rb_tree(&local_c0,&nodes->_M_t);
  p_Var15 = &local_c0._M_impl.super__Rb_tree_header._M_header;
  p_Var30 = p_Var15;
  if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var31 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var33 = p_Var30;
      _Var4 = p_Var31[1]._M_color;
      p_Var30 = p_Var31;
      if ((int)_Var4 < -1) {
        p_Var30 = p_Var33;
      }
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var31->_M_left)[(int)_Var4 < -1];
    } while ((&p_Var31->_M_left)[(int)_Var4 < -1] != (_Base_ptr)0x0);
    if (p_Var30 != p_Var15) {
      if ((int)_Var4 < -1) {
        p_Var31 = p_Var33;
      }
      if ((int)p_Var31[1]._M_color < 0) {
        p_Var15 = p_Var30;
      }
    }
  }
  local_6a0 = p_Var15[1]._M_parent;
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~_Rb_tree(&local_c0);
  p_Var15 = (local_628->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_6a8 = &(local_628->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var15 != local_6a8) {
    do {
      local_6f8 = (undefined1  [8])0x0;
      pVStack_6f0 = (VarId *)0x0;
      local_6e8 = (VarId *)0x0;
      local_678._0_4_ = p_Var15[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_2f8,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var15[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_1b0,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var15[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_358,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var15[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_2b8,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      if (local_6f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != local_6a8);
  }
  local_698 = (void *)0x0;
  iStack_690._M_current = (int *)0x0;
  local_688 = (int *)0x0;
  local_638 = (_Elt_pointer)0x0;
  ppiStack_630 = (_Map_pointer)0x0;
  local_648 = (pointer)0x0;
  piStack_640 = (_Elt_pointer)0x0;
  local_658 = (pointer)0x0;
  ppiStack_650 = (_Map_pointer)0x0;
  local_668 = (pointer)0x0;
  pVStack_660 = (pointer)0x0;
  local_678._0_8_ = (_Map_pointer)0x0;
  local_678._8_8_ = (pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_678,0);
  p_Var23 = local_6a0;
  if (iStack_690._M_current == local_688) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_698,iStack_690,(int *)local_6a0);
  }
  else {
    *iStack_690._M_current = local_6a0->_M_color;
    iStack_690._M_current = iStack_690._M_current + 1;
  }
  if (local_648 == (pointer)(local_638 + -1)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)local_678,(int *)p_Var23);
  }
  else {
    *(_Rb_tree_color *)&(local_648->super_Displayable)._vptr_Displayable = p_Var23->_M_color;
    local_648 = (pointer)((long)&(local_648->super_Displayable)._vptr_Displayable + 4);
  }
  bVar41 = local_648 == local_668;
  while (!bVar41) {
    p_Var23 = (local_628->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var24 = local_6a8;
    if (p_Var23 != (_Rb_tree_node_base *)0x0) {
      iVar14 = *(int *)&(local_668->super_Displayable)._vptr_Displayable;
      p_Var26 = local_6a8;
      do {
        if (iVar14 <= (int)p_Var23[1]._M_color) {
          p_Var26 = p_Var23;
        }
        p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < iVar14];
      } while (p_Var23 != (_Base_ptr)0x0);
      if ((p_Var26 != local_6a8) && (p_Var24 = p_Var26, iVar14 < (int)p_Var26[1]._M_color)) {
        p_Var24 = local_6a8;
      }
    }
    p_Var15 = p_Var24[1]._M_parent;
    if (local_668 == (pointer)&local_658[-1].field_0xc) {
      operator_delete(pVStack_660,0x200);
      ppiVar11 = ppiStack_650;
      ppiStack_650 = ppiStack_650 + 1;
      local_668 = (pointer)ppiVar11[1];
      pVStack_660 = local_668;
      local_658 = local_668 + 0x20;
    }
    else {
      local_668 = (pointer)((long)&(local_668->super_Displayable)._vptr_Displayable + 4);
    }
    p_Var30 = *(_Base_ptr *)(p_Var15 + 1);
    if (p_Var15[1]._M_parent != p_Var30) {
      p_Var23 = (_Rb_tree_node_base *)0x0;
      local_620 = p_Var15;
      do {
        _Var16 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_698,iStack_690._M_current,
                            *(undefined8 *)(&p_Var30->_M_color + (long)p_Var23 * 2));
        p_Var30 = *(_Base_ptr *)(p_Var15 + 1);
        if (_Var16._M_current == iStack_690._M_current) {
          local_6f8 = (undefined1  [8])0x0;
          pVStack_6f0 = (VarId *)0x0;
          local_6e8 = (VarId *)0x0;
          local_718 = (_Base_ptr)0x0;
          local_728 = (undefined1  [8])0x0;
          pVStack_720 = (VarId *)0x0;
          __k = *(key_type **)(&p_Var30->_M_color + (long)p_Var23 * 2);
          lVar40 = *(long *)(__k + 2);
          if (*(long *)(__k + 4) != lVar40) {
            uVar39 = 0;
            local_6a0 = p_Var23;
            do {
              __v = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                     *)(lVar40 + uVar39 * 0x18);
              _Var3 = (__v->
                      super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      ).
                      super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      ._M_index;
              if (_Var3 == '\x01') {
                pvVar18 = std::
                          get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                    (__v);
                peVar9 = (pvVar18->
                         super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                this = (pvVar18->
                       super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                if ((peVar9->kind - Return < 2) &&
                   ((peVar9->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>.
                    _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged == true)) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (&local_5e0,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_728);
                  if ((long)local_5e0.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_5e0.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e044:
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_288,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_6f8);
                    if ((long)local_288.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_288.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0) {
                      bVar41 = true;
                      if (local_288.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                      goto LAB_0018e2b9;
                    }
                    else {
                      uVar27 = (long)local_288.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_288.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar5 = (peVar9->cond_or_ret).
                              super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                              super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                      if ((local_288.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                        bVar41 = false;
                      }
                      else {
                        puVar29 = &local_288.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar28 = 1;
                        do {
                          uVar37 = uVar28;
                          if (uVar27 + (uVar27 == 0) == uVar37) break;
                          uVar6 = *puVar29;
                          puVar29 = puVar29 + 4;
                          uVar28 = uVar37 + 1;
                        } while (uVar6 != uVar5);
                        bVar41 = uVar27 <= uVar37;
                      }
                    }
                    operator_delete(local_288.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_288.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_288.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    uVar27 = (long)local_5e0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5e0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4;
                    uVar5 = (peVar9->cond_or_ret).
                            super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                            super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                    if ((local_5e0.
                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                      puVar29 = &local_5e0.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].id;
                      uVar28 = 1;
                      do {
                        uVar37 = uVar28;
                        if (uVar27 + (uVar27 == 0) == uVar37) break;
                        uVar6 = *puVar29;
                        puVar29 = puVar29 + 4;
                        uVar28 = uVar37 + 1;
                      } while (uVar6 != uVar5);
                      if (uVar27 <= uVar37) goto LAB_0018e044;
                    }
                    bVar41 = false;
                  }
LAB_0018e2b9:
                  if (local_5e0.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_5e0.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_5e0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_5e0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar41) {
                    if ((_Base_ptr)pVStack_720 == local_718) {
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_728,(iterator)pVStack_720,(VarId *)&peVar9->cond_or_ret);
                    }
                    else {
                      (pVStack_720->super_Displayable)._vptr_Displayable =
                           (_func_int **)&PTR_display_001eb100;
                      pVStack_720->id =
                           (peVar9->cond_or_ret).
                           super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                           super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                      pVStack_720 = pVStack_720 + 1;
                    }
                  }
                }
LAB_0018e311:
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0018f7e0:
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                }
              }
              else if (_Var3 == '\0') {
                pvVar17 = std::
                          get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                    (__v);
                peVar8 = (pvVar17->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                this = (pvVar17->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                if (iVar14 == 0) {
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      this->_M_use_count = this->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      this->_M_use_count = this->_M_use_count + 1;
                    }
                  }
                  if (*(char *)&peVar8[2].super_Displayable._vptr_Displayable == '\x01') {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_460,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    pVVar1 = &peVar8[1].dest;
                    pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)pVVar1);
                    if ((long)local_460.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_460.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e115:
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_370,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      if ((long)local_370.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_370.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0) {
                        bVar41 = true;
                        if (local_370.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                        goto LAB_0018e626;
                      }
                      else {
                        uVar27 = (long)local_370.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_370.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        if ((local_370.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id) {
                          bVar41 = false;
                        }
                        else {
                          puVar29 = &local_370.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar28 = 1;
                          do {
                            uVar37 = uVar28;
                            if (uVar27 + (uVar27 == 0) == uVar37) break;
                            uVar5 = *puVar29;
                            puVar29 = puVar29 + 4;
                            uVar28 = uVar37 + 1;
                          } while (uVar5 != pvVar19->id);
                          bVar41 = uVar27 <= uVar37;
                        }
                      }
                      operator_delete(local_370.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_370.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_370.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      uVar27 = (long)local_460.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_460.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      if ((local_460.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id) {
                        puVar29 = &local_460.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar28 = 1;
                        do {
                          uVar37 = uVar28;
                          if (uVar27 + (uVar27 == 0) == uVar37) break;
                          uVar5 = *puVar29;
                          puVar29 = puVar29 + 4;
                          uVar28 = uVar37 + 1;
                        } while (uVar5 != pvVar19->id);
                        if (uVar27 <= uVar37) goto LAB_0018e115;
                      }
                      bVar41 = false;
                    }
LAB_0018e626:
                    if (local_460.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_460.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_460.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_460.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar41) {
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      local_618 = (undefined1  [8])&PTR_display_001eb100;
                      uVar5 = pvVar19->id;
                      pVStack_610 = (VarId *)CONCAT44(pVStack_610._4_4_,uVar5);
                      if ((_Base_ptr)pVStack_720 == local_718) {
                        std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                        _M_realloc_insert<mir::inst::VarId_const&>
                                  ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                   local_728,(iterator)pVStack_720,(VarId *)local_618);
                      }
                      else {
                        (pVStack_720->super_Displayable)._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        pVStack_720->id = uVar5;
                        pVStack_720 = pVStack_720 + 1;
                      }
                    }
                  }
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (&local_478,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_728);
                  if ((long)local_478.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_478.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e6ff:
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_1c8,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_6f8);
                    if ((long)local_1c8.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1c8.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0) {
                      bVar41 = true;
                      if (local_1c8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                      goto LAB_0018e783;
                    }
                    else {
                      uVar27 = (long)local_1c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar5 = (peVar8->dest).id;
                      if ((local_1c8.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                        bVar41 = false;
                      }
                      else {
                        puVar29 = &local_1c8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar28 = 1;
                        do {
                          uVar37 = uVar28;
                          if (uVar27 + (uVar27 == 0) == uVar37) break;
                          uVar6 = *puVar29;
                          puVar29 = puVar29 + 4;
                          uVar28 = uVar37 + 1;
                        } while (uVar6 != uVar5);
                        bVar41 = uVar27 <= uVar37;
                      }
                    }
                    operator_delete(local_1c8.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1c8.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1c8.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    uVar27 = (long)local_478.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_478.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4;
                    uVar5 = (peVar8->dest).id;
                    if ((local_478.
                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                      puVar29 = &local_478.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].id;
                      uVar28 = 1;
                      do {
                        uVar37 = uVar28;
                        if (uVar27 + (uVar27 == 0) == uVar37) break;
                        uVar6 = *puVar29;
                        puVar29 = puVar29 + 4;
                        uVar28 = uVar37 + 1;
                      } while (uVar6 != uVar5);
                      if (uVar27 <= uVar37) goto LAB_0018e6ff;
                    }
                    bVar41 = false;
                  }
LAB_0018e783:
                  if (local_478.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_478.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_478.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_478.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar41) {
                    if (pVStack_6f0 == local_6e8) {
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                    }
                    else {
LAB_0018f7ba:
                      (pVStack_6f0->super_Displayable)._vptr_Displayable =
                           (_func_int **)&PTR_display_001eb100;
                      pVStack_6f0->id = (peVar8->dest).id;
                      pVStack_6f0 = pVStack_6f0 + 1;
                    }
                  }
                }
                else {
                  iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                  if (iVar14 == 1) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if (*(char *)&peVar8[2].super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_490,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      pVVar1 = &peVar8[1].dest;
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      if ((long)local_490.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_490.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e222:
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_388,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        if ((long)local_388.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_388.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0) {
                          bVar41 = true;
                          if (local_388.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                          goto LAB_0018e822;
                        }
                        else {
                          uVar27 = (long)local_388.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_388.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          if ((local_388.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id) {
                            bVar41 = false;
                          }
                          else {
                            puVar29 = &local_388.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar28 = 1;
                            do {
                              uVar37 = uVar28;
                              if (uVar27 + (uVar27 == 0) == uVar37) break;
                              uVar5 = *puVar29;
                              puVar29 = puVar29 + 4;
                              uVar28 = uVar37 + 1;
                            } while (uVar5 != pvVar19->id);
                            bVar41 = uVar27 <= uVar37;
                          }
                        }
                        operator_delete(local_388.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_388.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_388.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      else {
                        uVar27 = (long)local_490.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_490.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        if ((local_490.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id) {
                          puVar29 = &local_490.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar28 = 1;
                          do {
                            uVar37 = uVar28;
                            if (uVar27 + (uVar27 == 0) == uVar37) break;
                            uVar5 = *puVar29;
                            puVar29 = puVar29 + 4;
                            uVar28 = uVar37 + 1;
                          } while (uVar5 != pvVar19->id);
                          if (uVar27 <= uVar37) goto LAB_0018e222;
                        }
                        bVar41 = false;
                      }
LAB_0018e822:
                      if (local_490.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_490.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_490.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_490.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar41) {
                        pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar19);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          pVStack_720->id = pvVar19->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    if (*(char *)&peVar8[3].dest.super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_4a8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      puVar29 = &peVar8[2].dest.id;
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)puVar29);
                      if ((long)local_4a8.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_4a8.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e8fd:
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_3a0,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)puVar29);
                        if ((long)local_3a0.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_3a0.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0) {
                          bVar41 = true;
                          if (local_3a0.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                          goto LAB_0018e989;
                        }
                        else {
                          uVar27 = (long)local_3a0.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_3a0.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          if ((local_3a0.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id) {
                            bVar41 = false;
                          }
                          else {
                            puVar32 = &local_3a0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar28 = 1;
                            do {
                              uVar37 = uVar28;
                              if (uVar27 + (uVar27 == 0) == uVar37) break;
                              uVar5 = *puVar32;
                              puVar32 = puVar32 + 4;
                              uVar28 = uVar37 + 1;
                            } while (uVar5 != pvVar19->id);
                            bVar41 = uVar27 <= uVar37;
                          }
                        }
                        operator_delete(local_3a0.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3a0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3a0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      else {
                        uVar27 = (long)local_4a8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4a8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        if ((local_4a8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id) {
                          puVar32 = &local_4a8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar28 = 1;
                          do {
                            uVar37 = uVar28;
                            if (uVar27 + (uVar27 == 0) == uVar37) break;
                            uVar5 = *puVar32;
                            puVar32 = puVar32 + 4;
                            uVar28 = uVar37 + 1;
                          } while (uVar5 != pvVar19->id);
                          if (uVar27 <= uVar37) goto LAB_0018e8fd;
                        }
                        bVar41 = false;
                      }
LAB_0018e989:
                      if (local_4a8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_4a8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4a8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4a8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar41) {
                        pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)puVar29);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar19);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          pVStack_720->id = pvVar19->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_4c0,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    if ((long)local_4c0.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4c0.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018ea4e:
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_1e0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      if ((long)local_1e0.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1e0.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0) {
                        bVar41 = true;
                        if (local_1e0.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                        goto LAB_0018ead2;
                      }
                      else {
                        uVar27 = (long)local_1e0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1e0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar5 = (peVar8->dest).id;
                        if ((local_1e0.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                          bVar41 = false;
                        }
                        else {
                          puVar29 = &local_1e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar28 = 1;
                          do {
                            uVar37 = uVar28;
                            if (uVar27 + (uVar27 == 0) == uVar37) break;
                            uVar6 = *puVar29;
                            puVar29 = puVar29 + 4;
                            uVar28 = uVar37 + 1;
                          } while (uVar6 != uVar5);
                          bVar41 = uVar27 <= uVar37;
                        }
                      }
                      operator_delete(local_1e0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_1e0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_1e0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      uVar27 = (long)local_4c0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4c0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar5 = (peVar8->dest).id;
                      if ((local_4c0.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                        puVar29 = &local_4c0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar28 = 1;
                        do {
                          uVar37 = uVar28;
                          if (uVar27 + (uVar27 == 0) == uVar37) break;
                          uVar6 = *puVar29;
                          puVar29 = puVar29 + 4;
                          uVar28 = uVar37 + 1;
                        } while (uVar6 != uVar5);
                        if (uVar27 <= uVar37) goto LAB_0018ea4e;
                      }
                      bVar41 = false;
                    }
LAB_0018ead2:
                    if (local_4c0.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_4c0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_4c0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_4c0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar41) {
                      if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                    }
                  }
                  else {
                    iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                    if (iVar14 == 6) {
                      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          this->_M_use_count = this->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          this->_M_use_count = this->_M_use_count + 1;
                        }
                      }
                      pp_Var20 = peVar8[2].dest.super_Displayable._vptr_Displayable;
                      if (*(_func_int ***)&peVar8[2].dest.id != pp_Var20) {
                        uVar27 = 0;
                        do {
                          if (*(char *)(pp_Var20 + uVar27 * 4 + 3) == '\x01') {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_4d8,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_728);
                            pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 (peVar8[2].dest.super_Displayable._vptr_Displayable
                                                 + uVar27 * 4 + 1));
                            if ((long)local_4d8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_4d8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e407:
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_3b8,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)
                                                   (peVar8[2].dest.super_Displayable.
                                                    _vptr_Displayable + uVar27 * 4 + 1));
                              if ((long)local_3b8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3b8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                                bVar41 = true;
                                if (local_3b8.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                goto LAB_0018e49c;
                              }
                              else {
                                uVar28 = (long)local_3b8.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_3b8.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                if ((local_3b8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id)
                                {
                                  bVar41 = false;
                                }
                                else {
                                  puVar29 = &local_3b8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar37 = 1;
                                  do {
                                    uVar36 = uVar37;
                                    if (uVar28 + (uVar28 == 0) == uVar36) break;
                                    uVar5 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar37 = uVar36 + 1;
                                  } while (uVar5 != pvVar19->id);
                                  bVar41 = uVar28 <= uVar36;
                                }
                              }
                              operator_delete(local_3b8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_3b8.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_3b8.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            else {
                              uVar28 = (long)local_4d8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_4d8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              if ((local_4d8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id) {
                                puVar29 = &local_4d8.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar37 = 1;
                                do {
                                  uVar36 = uVar37;
                                  if (uVar28 + (uVar28 == 0) == uVar36) break;
                                  uVar5 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar37 = uVar36 + 1;
                                } while (uVar5 != pvVar19->id);
                                if (uVar28 <= uVar36) goto LAB_0018e407;
                              }
                              bVar41 = false;
                            }
LAB_0018e49c:
                            if (local_4d8.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_4d8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_4d8.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_4d8.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            pp_Var20 = peVar8[2].dest.super_Displayable._vptr_Displayable;
                            if (bVar41) {
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)
                                                   (pp_Var20 + uVar27 * 4 + 1));
                              local_618 = (undefined1  [8])&PTR_display_001eb100;
                              uVar5 = pvVar19->id;
                              pVStack_610 = (VarId *)CONCAT44(pVStack_610._4_4_,uVar5);
                              if ((_Base_ptr)pVStack_720 == local_718) {
                                std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                                _M_realloc_insert<mir::inst::VarId_const&>
                                          ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                            *)local_728,(iterator)pVStack_720,(VarId *)local_618);
                              }
                              else {
                                (pVStack_720->super_Displayable)._vptr_Displayable =
                                     (_func_int **)&PTR_display_001eb100;
                                pVStack_720->id = uVar5;
                                pVStack_720 = pVStack_720 + 1;
                              }
                              pp_Var20 = peVar8[2].dest.super_Displayable._vptr_Displayable;
                            }
                          }
                          uVar27 = uVar27 + 1;
                        } while (uVar27 < (ulong)(*(long *)&peVar8[2].dest.id - (long)pp_Var20 >> 5)
                                );
                      }
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_4f0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      if ((long)local_4f0.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_4f0.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018e5a1:
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_1f8,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        if ((long)local_1f8.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1f8.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0) {
                          bVar41 = true;
                          if (local_1f8.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                          goto LAB_0018eb56;
                        }
                        else {
                          uVar27 = (long)local_1f8.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1f8.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          uVar5 = (peVar8->dest).id;
                          if ((local_1f8.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                            bVar41 = false;
                          }
                          else {
                            puVar29 = &local_1f8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar28 = 1;
                            do {
                              uVar37 = uVar28;
                              if (uVar27 + (uVar27 == 0) == uVar37) break;
                              uVar6 = *puVar29;
                              puVar29 = puVar29 + 4;
                              uVar28 = uVar37 + 1;
                            } while (uVar6 != uVar5);
                            bVar41 = uVar27 <= uVar37;
                          }
                        }
                        operator_delete(local_1f8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1f8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_1f8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      else {
                        uVar27 = (long)local_4f0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4f0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar5 = (peVar8->dest).id;
                        if ((local_4f0.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                          puVar29 = &local_4f0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar28 = 1;
                          do {
                            uVar37 = uVar28;
                            if (uVar27 + (uVar27 == 0) == uVar37) break;
                            uVar6 = *puVar29;
                            puVar29 = puVar29 + 4;
                            uVar28 = uVar37 + 1;
                          } while (uVar6 != uVar5);
                          if (uVar27 <= uVar37) goto LAB_0018e5a1;
                        }
                        bVar41 = false;
                      }
LAB_0018eb56:
                      if (local_4f0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_4f0.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4f0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4f0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar41) {
                        if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                        std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                        _M_realloc_insert<mir::inst::VarId_const&>
                                  ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                   local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                      }
                    }
                    else {
                      iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                      if (iVar14 == 2) {
                        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            this->_M_use_count = this->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            this->_M_use_count = this->_M_use_count + 1;
                          }
                        }
                        if (*(char *)&peVar8[2].dest.super_Displayable._vptr_Displayable == '\0') {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (&local_508,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_728);
                          peVar2 = peVar8 + 1;
                          pvVar21 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)peVar2);
                          if ((long)local_508.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_508.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018ec5a:
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_3d0,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_6f8);
                            pvVar21 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)peVar2);
                            if ((long)local_3d0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_3d0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
                              bVar41 = true;
                              if (local_3d0.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                              goto LAB_0018edca;
                            }
                            else {
                              uVar27 = (long)local_3d0.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_3d0.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              if ((local_3d0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id == pvVar21->id) {
                                bVar41 = false;
                              }
                              else {
                                puVar29 = &local_3d0.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar5 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar5 != pvVar21->id);
                                bVar41 = uVar27 <= uVar37;
                              }
                            }
                            operator_delete(local_3d0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3d0.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3d0.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          else {
                            uVar27 = (long)local_508.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_508.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4;
                            if ((local_508.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->id != pvVar21->id) {
                              puVar29 = &local_508.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].id;
                              uVar28 = 1;
                              do {
                                uVar37 = uVar28;
                                if (uVar27 + (uVar27 == 0) == uVar37) break;
                                uVar5 = *puVar29;
                                puVar29 = puVar29 + 4;
                                uVar28 = uVar37 + 1;
                              } while (uVar5 != pvVar21->id);
                              if (uVar27 <= uVar37) goto LAB_0018ec5a;
                            }
                            bVar41 = false;
                          }
LAB_0018edca:
                          if (local_508.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_508.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_508.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_508.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (bVar41) {
                            pvVar21 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)peVar2);
                            if ((_Base_ptr)pVStack_720 == local_718) {
                              std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                              _M_realloc_insert<mir::inst::VarId_const&>
                                        ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                          *)local_728,(iterator)pVStack_720,pvVar21);
                            }
                            else {
                              (pVStack_720->super_Displayable)._vptr_Displayable =
                                   (_func_int **)&PTR_display_001eb100;
                              pVStack_720->id = pvVar21->id;
                              pVStack_720 = pVStack_720 + 1;
                            }
                          }
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_520,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_728);
                        if ((long)local_520.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_520.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018ee8f:
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (&local_210,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                          if ((long)local_210.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_210.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == 0) {
                            bVar41 = true;
                            if (local_210.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                            goto LAB_0018ef13;
                          }
                          else {
                            uVar27 = (long)local_210.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_210.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4;
                            uVar5 = (peVar8->dest).id;
                            if ((local_210.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                              bVar41 = false;
                            }
                            else {
                              puVar29 = &local_210.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].id;
                              uVar28 = 1;
                              do {
                                uVar37 = uVar28;
                                if (uVar27 + (uVar27 == 0) == uVar37) break;
                                uVar6 = *puVar29;
                                puVar29 = puVar29 + 4;
                                uVar28 = uVar37 + 1;
                              } while (uVar6 != uVar5);
                              bVar41 = uVar27 <= uVar37;
                            }
                          }
                          operator_delete(local_210.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_210.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_210.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        else {
                          uVar27 = (long)local_520.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_520.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          uVar5 = (peVar8->dest).id;
                          if ((local_520.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                            puVar29 = &local_520.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar28 = 1;
                            do {
                              uVar37 = uVar28;
                              if (uVar27 + (uVar27 == 0) == uVar37) break;
                              uVar6 = *puVar29;
                              puVar29 = puVar29 + 4;
                              uVar28 = uVar37 + 1;
                            } while (uVar6 != uVar5);
                            if (uVar27 <= uVar37) goto LAB_0018ee8f;
                          }
                          bVar41 = false;
                        }
LAB_0018ef13:
                        if (local_520.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_520.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_520.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_520.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (bVar41) {
                          if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                        }
                      }
                      else {
                        iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                        if (iVar14 == 3) {
                          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              this->_M_use_count = this->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              this->_M_use_count = this->_M_use_count + 1;
                            }
                          }
                          if (*(char *)&peVar8[2].super_Displayable._vptr_Displayable == '\x01') {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_538,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_728);
                            pVVar1 = &peVar8[1].dest;
                            pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)pVVar1);
                            if ((long)local_538.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_538.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018ed33:
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_3e8,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)pVVar1);
                              if ((long)local_3e8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3e8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                                bVar41 = true;
                                if (local_3e8.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                goto LAB_0018f07a;
                              }
                              else {
                                uVar27 = (long)local_3e8.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_3e8.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                if ((local_3e8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id)
                                {
                                  bVar41 = false;
                                }
                                else {
                                  puVar29 = &local_3e8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar5 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar5 != pvVar19->id);
                                  bVar41 = uVar27 <= uVar37;
                                }
                              }
                              operator_delete(local_3e8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_3e8.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_3e8.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            else {
                              uVar27 = (long)local_538.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_538.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              if ((local_538.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id) {
                                puVar29 = &local_538.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar5 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar5 != pvVar19->id);
                                if (uVar27 <= uVar37) goto LAB_0018ed33;
                              }
                              bVar41 = false;
                            }
LAB_0018f07a:
                            if (local_538.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_538.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_538.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_538.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (bVar41) {
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)pVVar1);
                              if ((_Base_ptr)pVStack_720 == local_718) {
                                std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                                _M_realloc_insert<mir::inst::VarId_const&>
                                          ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                            *)local_728,(iterator)pVStack_720,pvVar19);
                              }
                              else {
                                (pVStack_720->super_Displayable)._vptr_Displayable =
                                     (_func_int **)&PTR_display_001eb100;
                                pVStack_720->id = pvVar19->id;
                                pVStack_720 = pVStack_720 + 1;
                              }
                            }
                          }
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (&local_550,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_728);
                          if ((long)local_550.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_550.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018f13f:
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_228,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_6f8);
                            if ((long)local_228.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_228.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
                              bVar41 = true;
                              if (local_228.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                              goto LAB_0018f1c3;
                            }
                            else {
                              uVar27 = (long)local_228.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_228.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              uVar5 = (peVar8->dest).id;
                              if ((local_228.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                                bVar41 = false;
                              }
                              else {
                                puVar29 = &local_228.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar6 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar6 != uVar5);
                                bVar41 = uVar27 <= uVar37;
                              }
                            }
                            operator_delete(local_228.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_228.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_228.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          else {
                            uVar27 = (long)local_550.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_550.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4;
                            uVar5 = (peVar8->dest).id;
                            if ((local_550.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                              puVar29 = &local_550.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].id;
                              uVar28 = 1;
                              do {
                                uVar37 = uVar28;
                                if (uVar27 + (uVar27 == 0) == uVar37) break;
                                uVar6 = *puVar29;
                                puVar29 = puVar29 + 4;
                                uVar28 = uVar37 + 1;
                              } while (uVar6 != uVar5);
                              if (uVar27 <= uVar37) goto LAB_0018f13f;
                            }
                            bVar41 = false;
                          }
LAB_0018f1c3:
                          if (local_550.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_550.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_550.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_550.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (bVar41) {
                            if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                            std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                            _M_realloc_insert<mir::inst::VarId_const&>
                                      ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                       local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                          }
                        }
                        else {
                          iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                          if (iVar14 == 4) {
                            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                this->_M_use_count = this->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                this->_M_use_count = this->_M_use_count + 1;
                              }
                            }
                            if (*(char *)&peVar8[2].super_Displayable._vptr_Displayable == '\x01') {
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_568,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_728);
                              pVVar1 = &peVar8[1].dest;
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)pVVar1);
                              if ((long)local_568.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_568.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018efe3:
                                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                                vector(&local_400,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_6f8);
                                pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                    ((variant<int,_mir::inst::VarId> *)pVVar1);
                                if ((long)local_400.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_400.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start == 0) {
                                  bVar41 = true;
                                  if (local_400.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                  goto LAB_0018f32a;
                                }
                                else {
                                  uVar27 = (long)local_400.
                                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_400.
                                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 4;
                                  if ((local_400.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id
                                     ) {
                                    bVar41 = false;
                                  }
                                  else {
                                    puVar29 = &local_400.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].id;
                                    uVar28 = 1;
                                    do {
                                      uVar37 = uVar28;
                                      if (uVar27 + (uVar27 == 0) == uVar37) break;
                                      uVar5 = *puVar29;
                                      puVar29 = puVar29 + 4;
                                      uVar28 = uVar37 + 1;
                                    } while (uVar5 != pvVar19->id);
                                    bVar41 = uVar27 <= uVar37;
                                  }
                                }
                                operator_delete(local_400.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_400.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_400.
                                                                                                                
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              else {
                                uVar27 = (long)local_568.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_568.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                if ((local_568.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id)
                                {
                                  puVar29 = &local_568.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar5 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar5 != pvVar19->id);
                                  if (uVar27 <= uVar37) goto LAB_0018efe3;
                                }
                                bVar41 = false;
                              }
LAB_0018f32a:
                              if (local_568.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(local_568.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_568.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_568.
                                                                                                                
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              if (bVar41) {
                                pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                    ((variant<int,_mir::inst::VarId> *)pVVar1);
                                if ((_Base_ptr)pVStack_720 == local_718) {
                                  std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                                  _M_realloc_insert<mir::inst::VarId_const&>
                                            ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                              *)local_728,(iterator)pVStack_720,pvVar19);
                                }
                                else {
                                  (pVStack_720->super_Displayable)._vptr_Displayable =
                                       (_func_int **)&PTR_display_001eb100;
                                  pVStack_720->id = pvVar19->id;
                                  pVStack_720 = pVStack_720 + 1;
                                }
                              }
                            }
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_580,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_728);
                            if ((long)local_580.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_580.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018f3ef:
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_240,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                              if ((long)local_240.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_240.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                                bVar41 = true;
                                if (local_240.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                goto LAB_0018f473;
                              }
                              else {
                                uVar27 = (long)local_240.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_240.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                uVar5 = (peVar8->dest).id;
                                if ((local_240.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                                  bVar41 = false;
                                }
                                else {
                                  puVar29 = &local_240.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar6 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar6 != uVar5);
                                  bVar41 = uVar27 <= uVar37;
                                }
                              }
                              operator_delete(local_240.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_240.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_240.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            else {
                              uVar27 = (long)local_580.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_580.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              uVar5 = (peVar8->dest).id;
                              if ((local_580.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                                puVar29 = &local_580.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar6 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar6 != uVar5);
                                if (uVar27 <= uVar37) goto LAB_0018f3ef;
                              }
                              bVar41 = false;
                            }
LAB_0018f473:
                            if (local_580.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_580.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_580.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_580.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (bVar41) {
                              if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                              std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                              _M_realloc_insert<mir::inst::VarId_const&>
                                        ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                          *)local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                            }
                          }
                          else {
                            iVar14 = (*(peVar8->super_Displayable)._vptr_Displayable[1])(peVar8);
                            if (iVar14 != 5) goto LAB_0018e311;
                            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                this->_M_use_count = this->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                this->_M_use_count = this->_M_use_count + 1;
                              }
                            }
                            if ((char)peVar8[2].dest.id == '\x01') {
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_598,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_728);
                              peVar2 = peVar8 + 2;
                              pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)peVar2);
                              if ((long)local_598.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_598.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018f293:
                                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                                vector(&local_418,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_6f8);
                                pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                    ((variant<int,_mir::inst::VarId> *)peVar2);
                                if ((long)local_418.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_418.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start == 0) {
                                  bVar41 = true;
                                  if (local_418.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                  goto LAB_0018f501;
                                }
                                else {
                                  uVar27 = (long)local_418.
                                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_418.
                                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 4;
                                  if ((local_418.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->id == pvVar19->id
                                     ) {
                                    bVar41 = false;
                                  }
                                  else {
                                    puVar29 = &local_418.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].id;
                                    uVar28 = 1;
                                    do {
                                      uVar37 = uVar28;
                                      if (uVar27 + (uVar27 == 0) == uVar37) break;
                                      uVar5 = *puVar29;
                                      puVar29 = puVar29 + 4;
                                      uVar28 = uVar37 + 1;
                                    } while (uVar5 != pvVar19->id);
                                    bVar41 = uVar27 <= uVar37;
                                  }
                                }
                                operator_delete(local_418.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_418.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_418.
                                                                                                                
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              else {
                                uVar27 = (long)local_598.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_598.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                if ((local_598.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id != pvVar19->id)
                                {
                                  puVar29 = &local_598.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar5 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar5 != pvVar19->id);
                                  if (uVar27 <= uVar37) goto LAB_0018f293;
                                }
                                bVar41 = false;
                              }
LAB_0018f501:
                              if (local_598.
                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(local_598.
                                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_598.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_598.
                                                                                                                
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              if (bVar41) {
                                pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                                    ((variant<int,_mir::inst::VarId> *)peVar2);
                                if ((_Base_ptr)pVStack_720 == local_718) {
                                  std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                                  _M_realloc_insert<mir::inst::VarId_const&>
                                            ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                              *)local_728,(iterator)pVStack_720,pvVar19);
                                }
                                else {
                                  (pVStack_720->super_Displayable)._vptr_Displayable =
                                       (_func_int **)&PTR_display_001eb100;
                                  pVStack_720->id = pvVar19->id;
                                  pVStack_720 = pVStack_720 + 1;
                                }
                              }
                            }
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_5b0,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_728);
                            if ((long)local_5b0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_5b0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018f5c6:
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_258,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                              if ((long)local_258.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_258.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                                bVar41 = true;
                                bVar13 = true;
                                if (local_258.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                goto LAB_0018f64a;
                              }
                              else {
                                uVar27 = (long)local_258.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_258.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                uVar5 = *(uint32_t *)
                                         &peVar8[1].dest.super_Displayable._vptr_Displayable;
                                if ((local_258.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                                  bVar13 = false;
                                }
                                else {
                                  puVar29 = &local_258.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar6 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar6 != uVar5);
                                  bVar13 = uVar27 <= uVar37;
                                }
                              }
                              bVar41 = bVar13;
                              operator_delete(local_258.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_258.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_258.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            else {
                              uVar27 = (long)local_5b0.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_5b0.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              uVar5 = *(uint32_t *)
                                       &peVar8[1].dest.super_Displayable._vptr_Displayable;
                              if ((local_5b0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                                puVar29 = &local_5b0.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar6 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar6 != uVar5);
                                if (uVar27 <= uVar37) goto LAB_0018f5c6;
                              }
                              bVar41 = false;
                            }
LAB_0018f64a:
                            if (local_5b0.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_5b0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_5b0.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_5b0.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (bVar41) {
                              if ((_Base_ptr)pVStack_720 == local_718) {
                                std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                                _M_realloc_insert<mir::inst::VarId_const&>
                                          ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                            *)local_728,(iterator)pVStack_720,(VarId *)(peVar8 + 1))
                                ;
                              }
                              else {
                                (pVStack_720->super_Displayable)._vptr_Displayable =
                                     (_func_int **)&PTR_display_001eb100;
                                pVStack_720->id =
                                     *(uint32_t *)
                                      &peVar8[1].dest.super_Displayable._vptr_Displayable;
                                pVStack_720 = pVStack_720 + 1;
                              }
                            }
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_5c8,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_728);
                            if ((long)local_5c8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_5c8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0018f708:
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(&local_270,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_6f8);
                              if ((long)local_270.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_270.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                                bVar41 = true;
                                if (local_270.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                                goto LAB_0018f78c;
                              }
                              else {
                                uVar27 = (long)local_270.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_270.
                                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4;
                                uVar5 = (peVar8->dest).id;
                                if ((local_270.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id == uVar5) {
                                  bVar41 = false;
                                }
                                else {
                                  puVar29 = &local_270.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].id;
                                  uVar28 = 1;
                                  do {
                                    uVar37 = uVar28;
                                    if (uVar27 + (uVar27 == 0) == uVar37) break;
                                    uVar6 = *puVar29;
                                    puVar29 = puVar29 + 4;
                                    uVar28 = uVar37 + 1;
                                  } while (uVar6 != uVar5);
                                  bVar41 = uVar27 <= uVar37;
                                }
                              }
                              operator_delete(local_270.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_270.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_270.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            else {
                              uVar27 = (long)local_5c8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_5c8.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              uVar5 = (peVar8->dest).id;
                              if ((local_5c8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != uVar5) {
                                puVar29 = &local_5c8.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar28 = 1;
                                do {
                                  uVar37 = uVar28;
                                  if (uVar27 + (uVar27 == 0) == uVar37) break;
                                  uVar6 = *puVar29;
                                  puVar29 = puVar29 + 4;
                                  uVar28 = uVar37 + 1;
                                } while (uVar6 != uVar5);
                                if (uVar27 <= uVar37) goto LAB_0018f708;
                              }
                              bVar41 = false;
                            }
LAB_0018f78c:
                            if (local_5c8.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_5c8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_5c8.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_5c8.
                                                                                                            
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if (bVar41) {
                              if (pVStack_6f0 != local_6e8) goto LAB_0018f7ba;
                              std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                              _M_realloc_insert<mir::inst::VarId_const&>
                                        ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                          *)local_6f8,(iterator)pVStack_6f0,&peVar8->dest);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  goto LAB_0018f7e0;
                }
              }
              uVar39 = uVar39 + 1;
              __k = *(key_type **)(*(long *)(local_620 + 1) + (long)local_6a0 * 8);
              lVar40 = *(long *)(__k + 2);
              uVar27 = (*(long *)(__k + 4) - lVar40 >> 3) * -0x5555555555555555;
              p_Var15 = local_620;
              p_Var23 = local_6a0;
            } while (uVar39 <= uVar27 && uVar27 - uVar39 != 0);
          }
          pmVar22 = std::
                    map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  *)&local_2f8,__k);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                    (pmVar22,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_6f8);
          pmVar22 = std::
                    map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  *)&local_1b0,
                                 *(key_type **)(*(long *)(p_Var15 + 1) + (long)p_Var23 * 8));
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                    (pmVar22,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_728);
          lVar40 = *(long *)(p_Var15 + 1);
          piVar10 = *(int **)(lVar40 + (long)p_Var23 * 8);
          if (iStack_690._M_current == local_688) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_698,iStack_690,piVar10);
            lVar40 = *(long *)(p_Var15 + 1);
          }
          else {
            *iStack_690._M_current = *piVar10;
            iStack_690._M_current = iStack_690._M_current + 1;
          }
          piVar10 = *(int **)(lVar40 + (long)p_Var23 * 8);
          if (local_648 == (pointer)(local_638 + -1)) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)local_678,piVar10);
          }
          else {
            *(int *)&(local_648->super_Displayable)._vptr_Displayable = *piVar10;
            local_648 = (pointer)((long)&(local_648->super_Displayable)._vptr_Displayable + 4);
          }
          if (local_728 != (undefined1  [8])0x0) {
            operator_delete((void *)local_728,(long)local_718 - (long)local_728);
          }
          if (local_6f8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
          }
          p_Var30 = *(_Base_ptr *)(p_Var15 + 1);
        }
        p_Var23 = (_Rb_tree_node_base *)((long)&p_Var23->_M_color + 1);
      } while (p_Var23 < (undefined1 *)((long)p_Var15[1]._M_parent - (long)p_Var30 >> 3));
    }
    bVar41 = local_648 == local_668;
  }
  do {
    p_Var23 = (local_628->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var23 == local_6a8) break;
    bVar41 = false;
    do {
      p_Var38 = &local_358._M_impl.super__Rb_tree_header;
      b = (BasicBlock *)p_Var23[1]._M_parent;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_f0,&local_358);
      calcu_out((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8,b,
                (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)&local_f0);
      p_Var24 = p_Var23 + 1;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_f0);
      pmVar22 = std::
                map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                              *)&local_2b8,(key_type *)p_Var24);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                (pmVar22,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      _Var4 = p_Var24->_M_color;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_120,&local_1b0);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_150,&local_2b8);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_180,&local_2f8);
      calcu_in((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728,_Var4,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_120,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_150,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_180);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_180);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_150);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_120);
      p_Var15 = &p_Var38->_M_header;
      if (local_358._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        _Var4 = p_Var24->_M_color;
        p_Var30 = &p_Var38->_M_header;
        p_Var31 = local_358._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var33 = p_Var31;
          p_Var35 = p_Var30;
          _Var7 = p_Var33[1]._M_color;
          p_Var30 = p_Var33;
          if ((int)_Var7 < (int)_Var4) {
            p_Var30 = p_Var35;
          }
          p_Var31 = (&p_Var33->_M_left)[(int)_Var7 < (int)_Var4];
        } while ((&p_Var33->_M_left)[(int)_Var7 < (int)_Var4] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var30 != p_Var38) {
          if ((int)_Var7 < (int)_Var4) {
            p_Var33 = p_Var35;
          }
          p_Var15 = p_Var30;
          if ((int)_Var4 < (int)p_Var33[1]._M_color) {
            p_Var15 = &p_Var38->_M_header;
          }
        }
      }
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_430,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728
                );
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_448,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 &p_Var15[1]._M_parent);
      vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_618,
                         &local_430,&local_448);
      pVVar1 = pVStack_610;
      auVar12 = local_618;
      if (local_618 != (undefined1  [8])0x0) {
        operator_delete((void *)local_618,(long)local_608 - (long)local_618);
      }
      if (local_448.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_448.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_448.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_448.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_430.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_430.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_430.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_430.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined1  [8])pVVar1 != auVar12) {
        pmVar22 = std::
                  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                *)&local_358,(key_type *)p_Var24);
        bVar41 = true;
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (pmVar22,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728)
        ;
      }
      if (local_728 != (undefined1  [8])0x0) {
        operator_delete((void *)local_728,(long)local_718 - (long)local_728);
      }
      if (local_6f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
      }
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != local_6a8);
  } while (bVar41);
  local_710 = (_Rb_tree_node_base *)&pVStack_720;
  pVStack_720 = (VarId *)((ulong)pVStack_720 & 0xffffffff00000000);
  local_718 = (_Base_ptr)0x0;
  local_700 = 0;
  local_708 = local_710;
  if ((_Rb_tree_header *)local_2f8._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_2f8._M_impl.super__Rb_tree_header) {
    p_Var23 = (_Rb_tree_node_base *)(local_6b0 + 8);
    *(_Rb_tree_color *)(local_6b0 + 8) = _S_red;
    *(_Base_ptr *)(local_6b0 + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_node_base **)(local_6b0 + 0x18) = p_Var23;
    *(_Rb_tree_node_base **)(local_6b0 + 0x20) = p_Var23;
    *(size_t *)(local_6b0 + 0x28) = 0;
    p_Var15 = (_Base_ptr)(local_6b0 + 0x18);
  }
  else {
    p_Var15 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var30 = &local_2b8._M_impl.super__Rb_tree_header._M_header;
      if (local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        _Var4 = p_Var15[1]._M_color;
        p_Var31 = local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var33 = p_Var31;
          p_Var34 = p_Var30;
          _Var7 = p_Var33[1]._M_color;
          p_Var35 = p_Var33;
          if ((int)_Var7 < (int)_Var4) {
            p_Var35 = p_Var34;
          }
          p_Var30 = p_Var35;
          p_Var31 = (&p_Var33->_M_left)[(int)_Var7 < (int)_Var4];
        } while ((&p_Var33->_M_left)[(int)_Var7 < (int)_Var4] != (_Base_ptr)0x0);
        p_Var38 = &local_2b8._M_impl.super__Rb_tree_header;
        p_Var30 = &p_Var38->_M_header;
        if ((_Rb_tree_header *)p_Var35 != p_Var38) {
          if ((int)_Var7 < (int)_Var4) {
            p_Var33 = p_Var34;
          }
          p_Var30 = p_Var35;
          if ((int)_Var4 < (int)p_Var33[1]._M_color) {
            p_Var30 = &p_Var38->_M_header;
          }
        }
      }
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_310,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 &p_Var15[1]._M_parent);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_328,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 &p_Var30[1]._M_parent);
      vectors_intersection
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_618,&local_310
                 ,&local_328);
      local_6f8._0_4_ = p_Var15[1]._M_color;
      pVStack_6f0 = (VarId *)local_618;
      local_6e8 = pVStack_610;
      local_6e0 = local_608;
      local_618 = (undefined1  [8])0x0;
      pVStack_610 = (VarId *)0x0;
      local_608 = (_Base_ptr)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)local_728,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_6f8);
      if (pVStack_6f0 != (VarId *)0x0) {
        operator_delete(pVStack_6f0,(long)local_6e0 - (long)pVStack_6f0);
      }
      if (local_618 != (undefined1  [8])0x0) {
        operator_delete((void *)local_618,(long)local_608 - (long)local_618);
      }
      if (local_328.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_328.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_328.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_328.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_310.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_310.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_310.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)p_Var15 != &local_2f8._M_impl.super__Rb_tree_header);
    p_Var23 = (_Rb_tree_node_base *)(local_6b0 + 8);
    *(_Rb_tree_color *)(local_6b0 + 8) = _S_red;
    *(_Base_ptr *)(local_6b0 + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_node_base **)(local_6b0 + 0x18) = p_Var23;
    *(_Rb_tree_node_base **)(local_6b0 + 0x20) = p_Var23;
    *(size_t *)(local_6b0 + 0x28) = 0;
    p_Var15 = (_Base_ptr)(local_6b0 + 0x18);
    if (local_710 != (_Rb_tree_node_base *)&pVStack_720) {
      p_Var24 = local_710;
      local_6a0 = p_Var23;
      local_620 = (_Base_ptr)(local_6b0 + 0x18);
      do {
        p_Var15 = p_Var24[1]._M_parent;
        if (p_Var24[1]._M_left != p_Var15) {
          lVar40 = 8;
          uVar39 = 0;
          do {
            local_2c8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
            local_2c8.id = *(uint32_t *)((long)&p_Var15->_M_color + lVar40);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::_Rb_tree(&local_60,&local_2f8);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::_Rb_tree(&local_90,&local_1b0);
            blockHasVar((set<int,_std::less<int>,_std::allocator<int>_> *)local_618,&local_2c8,
                        (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                         *)&local_60,
                        (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                         *)&local_90);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::~_Rb_tree(&local_90);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::~_Rb_tree(&local_60);
            local_6f8 = (undefined1  [8])&PTR_display_001eb100;
            pVStack_6f0 = (VarId *)CONCAT44(pVStack_6f0._4_4_,
                                            *(undefined4 *)
                                             ((long)&(p_Var24[1]._M_parent)->_M_color + lVar40));
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&local_6e8,
                     (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_618);
            std::
            _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
            ::
            _M_insert_unique<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>
                      (local_6b0,
                       (pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_6f8);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&local_6e8);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_618);
            uVar39 = uVar39 + 1;
            p_Var15 = p_Var24[1]._M_parent;
            lVar40 = lVar40 + 0x10;
          } while (uVar39 < (ulong)((long)p_Var24[1]._M_left - (long)p_Var15 >> 4));
        }
        p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
        p_Var23 = local_6a0;
        p_Var15 = local_620;
      } while (p_Var24 != (_Rb_tree_node_base *)&pVStack_720);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar25 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,"*** desplay blocks ***",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  for (p_Var24 = *(_Rb_tree_node_base **)p_Var15; p_Var24 != p_Var23;
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
    (*(code *)**(undefined8 **)(p_Var24 + 1))(p_Var24 + 1,&std::cout);
    for (p_Var26 = p_Var24[2]._M_parent; p_Var26 != (_Rb_tree_node_base *)&p_Var24[1]._M_right;
        p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::operator<<(&std::cout,p_Var26[1]._M_color);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)local_728);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_678);
  if (local_698 != (void *)0x0) {
    operator_delete(local_698,(long)local_688 - (long)local_698);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_358);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_1b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_2f8);
  return (map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)local_6b0;
}

Assistant:

map<mir::inst::VarId, set<int>> active_var(map<int, BasicBlock*> nodes) {
  map<int, vector<mir::inst::VarId>> def;
  map<int, vector<mir::inst::VarId>> use;
  map<int, vector<mir::inst::VarId>> in;
  map<int, vector<mir::inst::VarId>> out;
  BasicBlock* entry = find_entry(nodes);
  map<int, vector<mir::inst::VarId>>::iterator it;
  // step0: initialization
  map<int, BasicBlock*>::iterator iter;
  for (iter = nodes.begin(); iter != nodes.end(); iter++) {
    vector<mir::inst::VarId> v;
    def.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    use.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    in.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    out.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
  }
  // step1: Find the def and use variables for each block
  // BFS
  vector<int> visit;
  std::queue<int> q;
  visit.push_back(entry->id);
  q.push(entry->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->nextBlock.size(); i++) {
      vector<int>::iterator it =
          find(visit.begin(), visit.end(), p->nextBlock[i]->id);
      if (it == visit.end()) {
        vector<mir::inst::VarId> def1;
        vector<mir::inst::VarId> use1;
        for (int j = 0; j < p->nextBlock[i]->inst.size(); j++) {
          if (p->nextBlock[i]->inst[j].index() == 0) {
            shared_ptr<mir::inst::Inst> ins = get<0>(p->nextBlock[i]->inst[j]);
            if (ins->inst_kind() == mir::inst::InstKind::Assign) {
              shared_ptr<mir::inst::AssignInst> in =
                  std::static_pointer_cast<mir::inst::AssignInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  mir::inst::VarId s = get<1>(in->src);
                  use1.push_back(s);
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
              shared_ptr<mir::inst::OpInst> in =
                  std::static_pointer_cast<mir::inst::OpInst>(ins);
              if (in->lhs.index() == 1) {
                if (!has_this(use1, get<1>(in->lhs)) &&
                    !has_this(def1, get<1>(in->lhs))) {
                  use1.push_back(get<1>(in->lhs));
                }
              }
              if (in->rhs.index() == 1) {
                if (!has_this(use1, get<1>(in->rhs)) &&
                    !has_this(def1, get<1>(in->rhs))) {
                  use1.push_back(get<1>(in->rhs));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
              shared_ptr<mir::inst::CallInst> in =
                  std::static_pointer_cast<mir::inst::CallInst>(ins);
              for (int k = 0; k < in->params.size(); k++) {
                if (in->params[k].index() == 1) {
                  if (!has_this(use1, get<1>(in->params[k])) &&
                      !has_this(def1, get<1>(in->params[k]))) {
                    mir::inst::VarId s = get<1>(in->params[k]);
                    use1.push_back(s);
                  }
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
              shared_ptr<mir::inst::RefInst> in =
                  std::static_pointer_cast<mir::inst::RefInst>(ins);
              if (in->val.index() == 0) {
                if (!has_this(use1, get<0>(in->val)) &&
                    !has_this(def1, get<0>(in->val))) {
                  use1.push_back(get<0>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
              shared_ptr<mir::inst::LoadInst> in =
                  std::static_pointer_cast<mir::inst::LoadInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  use1.push_back(get<1>(in->src));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
              shared_ptr<mir::inst::StoreInst> in =
                  std::static_pointer_cast<mir::inst::StoreInst>(ins);
              if (in->val.index() == 1) {
                if (!has_this(use1, get<1>(in->val)) &&
                    !has_this(def1, get<1>(in->val))) {
                  use1.push_back(get<1>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
              shared_ptr<mir::inst::PtrOffsetInst> in =
                  std::static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
              if (in->offset.index() == 1) {
                if (!has_this(use1, get<1>(in->offset)) &&
                    !has_this(def1, get<1>(in->offset))) {
                  use1.push_back(get<1>(in->offset));
                }
              }
              if (!has_this(use1, in->ptr) && !has_this(def1, in->ptr)) {
                use1.push_back(in->ptr);
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else {
              // nothing
            }
          } else if (p->nextBlock[i]->inst[j].index() == 1) {
            shared_ptr<mir::inst::JumpInstruction> ins =
                get<1>(p->nextBlock[i]->inst[j]);
            if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
                ins->kind == mir::inst::JumpInstructionKind::Return) {
              mir::inst::VarId var;
              if (ins->cond_or_ret && !has_this(use1, *ins->cond_or_ret) &&
                  !has_this(def1, *ins->cond_or_ret)) {
                use1.push_back(*ins->cond_or_ret);
              }
            }
          }
        }
        def[p->nextBlock[i]->id] = def1;
        use[p->nextBlock[i]->id] = use1;
        visit.push_back(p->nextBlock[i]->id);
        q.push(p->nextBlock[i]->id);
      }
    }
  }
  // output for test
  /*for (it = def.begin(); it != def.end(); it++) {
      cout << "def " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = use.begin(); it != use .end(); it++) {
      cout << "use " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step2: fill the in and out
  bool flag = true;
  while (flag) {
    flag = false;
    for (iter = nodes.begin(); iter != nodes.end(); iter++) {
      // cout << "|" << iter->second->id << endl;
      vector<mir::inst::VarId> _out = calcu_out(iter->second, in);
      out[iter->first] = _out;
      vector<mir::inst::VarId> _in = calcu_in(iter->first, use, out, def);
      it = in.find(iter->first);
      if (vectors_difference(_in, it->second).size() != 0) {
        flag = true;
        in[iter->first] = _in;
      }
    }
  }
  // output for test
  /*for (it = in.begin(); it != in.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = out.begin(); it != out.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step3: find the global var -- def && out
  map<int, vector<mir::inst::VarId>> global;
  for (it = def.begin(); it != def.end(); it++) {
    map<int, vector<mir::inst::VarId>>::iterator iter = out.find(it->first);
    global.insert(map<int, vector<mir::inst::VarId>>::value_type(
        it->first, vectors_intersection(it->second, iter->second)));
  }
  // output for test
  /*cout << endl << "*** desplay global var ***" << endl;
  for (it = global.begin(); it != global.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step4: build the blocks.
  map<mir::inst::VarId, set<int>> blocks;
  // mir::inst::VarId s0(0);
  for (it = global.begin(); it != global.end(); it++) {
    if (it->second.size() > 0) {
      for (int i = 0; i < it->second.size(); i++) {
        // if (it->second[i] != s0) {
        set<int> s = blockHasVar(it->second[i], def, use);
        blocks.insert(
            map<mir::inst::VarId, set<int>>::value_type(it->second[i], s));
        //}
      }
    }
  }
  cout << endl << "*** desplay blocks ***" << endl;
  map<mir::inst::VarId, set<int>>::iterator t;
  for (t = blocks.begin(); t != blocks.end(); t++) {
    cout << t->first;
    set<int>::iterator setit;
    for (setit = t->second.begin(); setit != t->second.end(); setit++) {
      cout << " " << *setit;
    }
    cout << endl;
  }
  return blocks;
}